

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> * __thiscall
wallet::CWallet::GetWalletDescriptors(CWallet *this,CScript *script)

{
  long lVar1;
  bool bVar2;
  reference ppSVar3;
  char *in_RSI;
  vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *in_RDI;
  long in_FS_OFFSET;
  DescriptorScriptPubKeyMan *desc_spk_man;
  ScriptPubKeyMan *spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range1;
  vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *descs;
  iterator __end1;
  iterator __begin1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock66;
  WalletDescriptor *in_stack_fffffffffffffe38;
  DescriptorScriptPubKeyMan *in_stack_fffffffffffffe40;
  AnnotatedMixin<std::recursive_mutex> *in_stack_fffffffffffffe48;
  vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *pszFile;
  AnnotatedMixin<std::recursive_mutex> *mutexIn;
  ScriptPubKeyMan *this_00;
  CScript *in_stack_fffffffffffffee8;
  CWallet *in_stack_fffffffffffffef0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszFile = in_RDI;
  std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>::vector
            ((vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *)
             in_stack_fffffffffffffe38);
  GetScriptPubKeyMans(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
           *)in_stack_fffffffffffffe40);
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
         *)in_stack_fffffffffffffe40);
  while (bVar2 = std::operator==((_Self *)in_stack_fffffffffffffe48,
                                 (_Self *)in_stack_fffffffffffffe40), ((bVar2 ^ 0xffU) & 1) != 0) {
    ppSVar3 = std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                        ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                         in_stack_fffffffffffffe38);
    this_00 = *ppSVar3;
    if (this_00 == (ScriptPubKeyMan *)0x0) {
      in_stack_fffffffffffffe48 = (AnnotatedMixin<std::recursive_mutex> *)0x0;
    }
    else {
      in_stack_fffffffffffffe48 =
           (AnnotatedMixin<std::recursive_mutex> *)
           __dynamic_cast(this_00,&ScriptPubKeyMan::typeinfo,&DescriptorScriptPubKeyMan::typeinfo,0)
      ;
    }
    if (in_stack_fffffffffffffe48 != (AnnotatedMixin<std::recursive_mutex> *)0x0) {
      mutexIn = in_stack_fffffffffffffe48;
      in_stack_fffffffffffffe40 =
           (DescriptorScriptPubKeyMan *)
           MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
                     ((AnnotatedMixin<std::recursive_mutex> *)in_stack_fffffffffffffe38);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)this_00,mutexIn,in_RSI,
                 (char *)pszFile,(int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
      DescriptorScriptPubKeyMan::GetWalletDescriptor(in_stack_fffffffffffffe40);
      std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>::push_back
                ((vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *)
                 in_stack_fffffffffffffe38,(value_type *)0x1bc8ca);
      WalletDescriptor::~WalletDescriptor(in_stack_fffffffffffffe38);
      UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
                ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_fffffffffffffe38);
    }
    std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
              ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_fffffffffffffe38);
  }
  std::
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
          *)in_stack_fffffffffffffe38);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return pszFile;
}

Assistant:

std::vector<WalletDescriptor> CWallet::GetWalletDescriptors(const CScript& script) const
{
    std::vector<WalletDescriptor> descs;
    for (const auto spk_man: GetScriptPubKeyMans(script)) {
        if (const auto desc_spk_man = dynamic_cast<DescriptorScriptPubKeyMan*>(spk_man)) {
            LOCK(desc_spk_man->cs_desc_man);
            descs.push_back(desc_spk_man->GetWalletDescriptor());
        }
    }
    return descs;
}